

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_dr_wav_get_length_in_pcm_frames(ma_dr_wav *pWav,ma_uint64 *pLength)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pWav != (ma_dr_wav *)0x0)) {
    *pLength = pWav->totalPCMFrameCount;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_dr_wav_get_length_in_pcm_frames(ma_dr_wav* pWav, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }
    *pLength = 0;
    if (pWav == NULL) {
        return MA_INVALID_ARGS;
    }
    *pLength = pWav->totalPCMFrameCount;
    return MA_SUCCESS;
}